

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O2

_Bool container_iterator_prev
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint16_t *value)

{
  long lVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  ulong uVar9;
  
  iVar6 = (int)CONCAT71(in_register_00000031,typecode);
  if (iVar6 == 3) {
    if (*value != 0) {
      uVar5 = *value - 1;
      *value = uVar5;
      lVar1 = *(long *)((long)c + 8);
      iVar6 = it->index;
      if (*(ushort *)(lVar1 + (long)iVar6 * 4) <= uVar5) {
        return true;
      }
      uVar4 = iVar6 - 1;
      it->index = uVar4;
      if (0 < iVar6) {
        uVar2 = *(short *)(lVar1 + 2 + (ulong)uVar4 * 4) + *(short *)(lVar1 + (ulong)uVar4 * 4);
        goto LAB_00114f90;
      }
    }
  }
  else if (iVar6 == 2) {
    iVar6 = it->index;
    uVar4 = iVar6 - 1;
    it->index = uVar4;
    if (0 < iVar6) {
      uVar2 = *(uint16_t *)(*(long *)((long)c + 8) + (ulong)uVar4 * 2);
LAB_00114f90:
      *value = uVar2;
      return true;
    }
  }
  else {
    iVar6 = it->index;
    uVar4 = iVar6 - 1;
    it->index = uVar4;
    if (0 < iVar6) {
      uVar8 = (ulong)(uVar4 >> 6);
      uVar3 = uVar4 | 0x3f;
      uVar9 = (ulong)(*(long *)(*(long *)((long)c + 8) + uVar8 * 8) << (~(byte)uVar4 & 0x3f)) >>
              (~(byte)uVar4 & 0x3f);
      uVar4 = uVar3;
      while (uVar9 == 0) {
        if ((long)uVar8 < 1) {
          return false;
        }
        lVar1 = uVar8 * 8;
        uVar8 = uVar8 - 1;
        uVar3 = uVar3 - 0x40;
        uVar4 = uVar4 - 0x40;
        uVar9 = *(ulong *)(*(long *)((long)c + 8) + -8 + lVar1);
      }
      lVar1 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar7 = (uint)lVar1 ^ 0x3f;
      it->index = uVar3 - uVar7;
      uVar2 = (short)uVar4 - (short)uVar7;
      goto LAB_00114f90;
    }
  }
  return false;
}

Assistant:

bool container_iterator_prev(const container_t *c, uint8_t typecode,
                             roaring_container_iterator_t *it,
                             uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            if (--it->index < 0) {
                return false;
            }

            const bitset_container_t *bc = const_CAST_bitset(c);
            int32_t wordindex = it->index / 64;
            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX >> (63 - (it->index % 64)));

            while (word == 0 && --wordindex >= 0) {
                word = bc->words[wordindex];
            }
            if (word == 0) {
                return false;
            }

            it->index = (wordindex * 64) + (63 - roaring_leading_zeroes(word));
            *value = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            if (--it->index < 0) {
                return false;
            }
            const array_container_t *ac = const_CAST_array(c);
            *value = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            if (*value == 0) {
                return false;
            }

            const run_container_t *rc = const_CAST_run(c);
            (*value)--;
            if (*value >= rc->runs[it->index].value) {
                return true;
            }

            if (--it->index < 0) {
                return false;
            }

            *value = rc->runs[it->index].value + rc->runs[it->index].length;
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}